

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O3

void operator_delete__(void *p,align_val_t param_2)

{
  undefined1 *puVar1;
  unsigned_short *puVar2;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this;
  void **ppvVar3;
  long lVar4;
  ulong uVar5;
  code *pcVar6;
  address_t n;
  BackendSlabMetadata *meta;
  address_t c_1;
  PagemapEntry *entry;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  address_t c;
  undefined8 *in_FS_OFFSET;
  
  this = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
         *in_FS_OFFSET;
  uVar7 = (ulong)p >> 0xe;
  uVar8 = snmalloc::
          BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
          ::concretePagemap.body[uVar7].
          super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
          .super_MetaEntryBase.remote_and_sizeclass;
  entry = snmalloc::
          BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
          ::concretePagemap.body + uVar7;
  if (&this->remote_alloc ==
      (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)
      (uVar8 & 0xffffffffffffff80)) {
    uVar8 = (ulong)(((uint)uVar8 & 0x7f) << 5);
    if ((*(ulong *)(snmalloc::sizeclass_metadata + uVar8 + 8) & (ulong)p) *
        *(ulong *)(snmalloc::sizeclass_metadata + uVar8 + 0x18) <
        *(ulong *)(snmalloc::sizeclass_metadata + uVar8 + 0x18)) {
      uVar8 = (entry->
              super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
              ).super_MetaEntryBase.meta;
      meta = (BackendSlabMetadata *)(uVar8 & 0xfffffffffffffffe);
      uVar8 = uVar8 >> 3;
      uVar7 = (this->entropy).bit_source;
      uVar5 = uVar7 >> 1;
      (this->entropy).bit_source = uVar5 | (ulong)((uVar7 & 1) != 0) << 0x3f;
      uVar9 = (uint)uVar5 & 1;
      ppvVar3 = (meta->
                super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                ).free_queue.end._M_elems[uVar9];
      *(address_t *)((long)p + 8) =
           ((snmalloc::freelist::Object::key_root.key2 ^ uVar8) + (long)p) *
           (snmalloc::freelist::Object::key_root.key1 + (long)ppvVar3);
      *ppvVar3 = (void *)(snmalloc::freelist::Object::key_root.key_next ^ (ulong)p ^ uVar8);
      (meta->
      super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
      ).free_queue.end._M_elems[uVar9] = (void **)p;
      puVar2 = (meta->
               super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
               ).free_queue.length._M_elems + uVar9;
      *puVar2 = *puVar2 + 1;
      puVar1 = &(meta->
                super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                ).free_queue.field_0x24;
      *(short *)puVar1 = *(short *)puVar1 + -1;
      if (*(short *)puVar1 != 0) {
        return;
      }
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_local_object_slow(this,(Alloc<void>)p,entry,meta);
      return;
    }
  }
  else if ((undefined1 *)(uVar8 & 0xffffffffffffff80) == (undefined1 *)0x0) {
    if (p == (void *)0x0) {
      return;
    }
  }
  else if (-1 < (char)uVar8) {
    lVar4 = (this->remote_dealloc_cache).capacity;
    lVar10 = lVar4 - *(long *)(snmalloc::sizeclass_metadata + (((uint)uVar8 & 0x7f) << 5));
    if (lVar10 == 0 || lVar4 < *(long *)(snmalloc::sizeclass_metadata + (((uint)uVar8 & 0x7f) << 5))
       ) {
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_remote_slow<snmalloc::CheckInitPthread>(this,entry,(Alloc<void>)p);
      return;
    }
    (this->remote_dealloc_cache).capacity = lVar10;
    if (p != (void *)0x0) {
      *(undefined8 *)p = 0;
      *(undefined8 *)((long)p + 8) = 0;
      uVar8 = snmalloc::
              BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
              ::concretePagemap.body[uVar7].
              super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
              .super_MetaEntryBase.remote_and_sizeclass;
    }
    uVar8 = uVar8 >> 0xe & 0xff;
    ppvVar3 = (this->remote_dealloc_cache).list._M_elems[uVar8].end._M_elems[0];
    *(address_t *)((long)p + 8) =
         (snmalloc::RemoteAllocator::key_global.key2 + (long)p) *
         (snmalloc::RemoteAllocator::key_global.key1 + (long)ppvVar3);
    *ppvVar3 = (void *)(snmalloc::RemoteAllocator::key_global.key_next ^ (ulong)p);
    (this->remote_dealloc_cache).list._M_elems[uVar8].end._M_elems[0] = (void **)p;
    return;
  }
  pcVar6 = (code *)invalidInstructionException();
  (*pcVar6)();
}

Assistant:

void operator delete[](void* p, std::align_val_t) EXCEPTSPEC
{
  snmalloc::libc::free(p);
}